

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.hxx
# Opt level: O2

future<void> __thiscall
ThreadPool::submit<void(&)(int,int,int),int&,int&,int&>
          (ThreadPool *this,_func_void_int_int_int *f,int *args,int *args_1,int *args_2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer *__ptr;
  future<void> fVar2;
  future<void> future;
  long *local_38;
  long *local_30;
  packaged_task<void_(int,_int,_int)> local_28;
  
  std::
  make_unique<WorkItem<void(&)(int,int,int),int&,int&,int&>,void(&)(int,int,int),int&,int&,int&>
            ((_func_void_int_int_int *)&local_38,args,args_1,args_2);
  std::packaged_task<void_(int,_int,_int)>::get_future(&local_28);
  local_30 = local_38;
  local_38 = (long *)0x0;
  WorkItemScheduler::submit((unique_ptr *)f);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  _Var1._M_pi = local_28._M_state.
                super___shared_ptr<std::__future_base::_Task_state_base<void_(int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  local_28._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_(int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this =
       local_28._M_state.
       super___shared_ptr<std::__future_base::_Task_state_base<void_(int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  local_28._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_(int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28._M_state.
              super___shared_ptr<std::__future_base::_Task_state_base<void_(int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  _Var1._M_pi = extraout_RDX;
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 8))();
    _Var1._M_pi = extraout_RDX_00;
  }
  fVar2.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  fVar2.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<void>)
         fVar2.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto ThreadPool::submit(Function&& f, Args&&... args)
{
    auto wi_ptr = std::make_unique<WorkItem<Function, Args...>>(f, args...);
    auto future = wi_ptr->get_future();
    this->sched_.submit(std::move(wi_ptr));

    return future;
}